

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::mod(Simulator *this,PCode *code)

{
  double dVar1;
  Type TVar2;
  reference pvVar3;
  int *piVar4;
  simulator_error *psVar5;
  double *pdVar6;
  deque<StackSymbol,_std::allocator<StackSymbol>_> *this_00;
  StackSymbol local_1b0;
  undefined1 local_162;
  allocator local_161;
  string local_160;
  int local_140;
  undefined1 local_13a;
  allocator local_139;
  string local_138;
  int local_118;
  undefined1 local_112;
  allocator local_111;
  string local_110;
  int local_f0;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8;
  int local_c4;
  double local_c0;
  double result;
  undefined1 local_a8 [8];
  StackSymbol second;
  StackSymbol first;
  PCode *code_local;
  Simulator *this_local;
  
  this_00 = &this->stack_;
  pvVar3 = std::deque<StackSymbol,_std::allocator<StackSymbol>_>::back(this_00);
  StackSymbol::StackSymbol
            ((StackSymbol *)
             &second.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pvVar3);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(this_00);
  pvVar3 = std::deque<StackSymbol,_std::allocator<StackSymbol>_>::back(this_00);
  StackSymbol::StackSymbol((StackSymbol *)local_a8,pvVar3);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(&this->stack_);
  TVar2 = StackSymbol::type((StackSymbol *)local_a8);
  if (TVar2 == kInt) {
    piVar4 = StackSymbol::int_value((StackSymbol *)local_a8);
    local_c0 = (double)*piVar4;
  }
  else {
    TVar2 = StackSymbol::type((StackSymbol *)local_a8);
    if (TVar2 != kReal) {
      local_ea = 1;
      psVar5 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_c4 = eip(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e8,anon_var_dwarf_a29d,&local_e9);
      simulator_error::simulator_error(psVar5,&local_c4,&local_e8);
      local_ea = 0;
      __cxa_throw(psVar5,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    pdVar6 = StackSymbol::real_value((StackSymbol *)local_a8);
    local_c0 = *pdVar6;
  }
  TVar2 = StackSymbol::type((StackSymbol *)
                            &second.value_.real_array.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
  if (TVar2 == kInt) {
    piVar4 = StackSymbol::int_value
                       ((StackSymbol *)
                        &second.value_.real_array.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    dVar1 = local_c0;
    if (*piVar4 == 0) {
      local_112 = 1;
      psVar5 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_f0 = eip(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_110,anon_var_dwarf_a2a8,&local_111);
      simulator_error::simulator_error(psVar5,&local_f0,&local_110);
      local_112 = 0;
      __cxa_throw(psVar5,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    piVar4 = StackSymbol::int_value
                       ((StackSymbol *)
                        &second.value_.real_array.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    local_c0 = fmod(dVar1,(double)*piVar4);
  }
  else {
    TVar2 = StackSymbol::type((StackSymbol *)
                              &second.value_.real_array.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
    if (TVar2 != kReal) {
      local_162 = 1;
      psVar5 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_140 = eip(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_160,anon_var_dwarf_a29d,&local_161);
      simulator_error::simulator_error(psVar5,&local_140,&local_160);
      local_162 = 0;
      __cxa_throw(psVar5,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    pdVar6 = StackSymbol::real_value
                       ((StackSymbol *)
                        &second.value_.real_array.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    dVar1 = local_c0;
    if (ABS(*pdVar6) < 1e-08) {
      local_13a = 1;
      psVar5 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_118 = eip(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_138,anon_var_dwarf_a2a8,&local_139);
      simulator_error::simulator_error(psVar5,&local_118,&local_138);
      local_13a = 0;
      __cxa_throw(psVar5,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    pdVar6 = StackSymbol::real_value
                       ((StackSymbol *)
                        &second.value_.real_array.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    local_c0 = fmod(dVar1,*pdVar6);
  }
  StackSymbol::StackSymbol(&local_1b0,&local_c0);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::push_back(&this->stack_,&local_1b0);
  StackSymbol::~StackSymbol(&local_1b0);
  inc_eip(this);
  StackSymbol::~StackSymbol((StackSymbol *)local_a8);
  StackSymbol::~StackSymbol
            ((StackSymbol *)
             &second.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Simulator::mod(const PCode &code) {
    StackSymbol first = stack_.back();
    stack_.pop_back();
    StackSymbol second = stack_.back();
    stack_.pop_back();

    double result;
    if (second.type() == StackSymbol::Type::kInt) {
        result = (double)second.int_value();
    } else if (second.type() == StackSymbol::Type::kReal) {
        result = (double)second.real_value();
    } else {
        throw simulator_error(eip(), "不合法的求余操作数");
    }
    if (first.type() == StackSymbol::Type::kInt) {
        if (first.int_value() == 0) {
            throw simulator_error(eip(), "mod 除数不能为 0");
        }
        result = std::fmod(result, (double)first.int_value());
    } else if (first.type() == StackSymbol::Type::kReal) {
        if (std::fabs(first.real_value()) < 1e-8) {
            throw simulator_error(eip(), "mod 除数不能为 0");
        }
        result = std::fmod(result, (double)first.real_value());
    } else {
        throw simulator_error(eip(), "不合法的求余操作数");
    }

    stack_.push_back(StackSymbol(result));
    inc_eip();
}